

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

void udp_example(void)

{
  allocator local_a9;
  shared_ptr<spdlog::logger> my_logger;
  udp_sink_config cfg;
  undefined1 local_70 [32];
  char *local_50;
  size_type local_48;
  char local_40 [8];
  undefined8 uStack_38;
  udp_sink_config local_30;
  
  std::__cxx11::string::string((string *)&local_50,"127.0.0.1",(allocator *)local_70);
  cfg.server_host._M_string_length = local_48;
  cfg.server_host._M_dataplus._M_p = (pointer)&cfg.server_host.field_2;
  if (local_50 == local_40) {
    cfg.server_host.field_2._8_8_ = uStack_38;
  }
  else {
    cfg.server_host._M_dataplus._M_p = local_50;
  }
  local_48 = 0;
  local_40[0] = '\0';
  cfg.server_port = 0x2b53;
  local_50 = local_40;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)local_70,"udplog",&local_a9);
  spdlog::sinks::udp_sink_config::udp_sink_config(&local_30,&cfg);
  spdlog::udp_logger_mt<spdlog::synchronous_factory>
            ((string *)&my_logger,(udp_sink_config *)local_70);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)local_70);
  spdlog::logger::set_level
            (my_logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,debug);
  spdlog::logger::info<char[12]>
            (my_logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (char (*) [12])"hello world");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&my_logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&cfg);
  return;
}

Assistant:

void udp_example() {
    spdlog::sinks::udp_sink_config cfg("127.0.0.1", 11091);
    auto my_logger = spdlog::udp_logger_mt("udplog", cfg);
    my_logger->set_level(spdlog::level::debug);
    my_logger->info("hello world");
}